

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.h
# Opt level: O2

Vec3 __thiscall ImageTexture::GetValue(ImageTexture *this,float u,float v,Vec3 *pos)

{
  ushort uVar1;
  long lVar2;
  undefined4 in_ECX;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined1 in_register_00001204 [12];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Vec3 VVar18;
  undefined1 auVar8 [16];
  int iVar13;
  undefined1 auVar14 [16];
  
  iVar13 = (int)*(undefined8 *)(pos->e + 2);
  fVar12 = (float)iVar13;
  fVar17 = (float)(int)((ulong)*(undefined8 *)(pos->e + 2) >> 0x20);
  auVar6._0_4_ = u * fVar12;
  auVar6._4_12_ = in_register_00001204;
  auVar8._0_8_ = auVar6._0_8_;
  auVar8._8_4_ = in_register_00001204._0_4_;
  auVar8._12_4_ = fVar17;
  auVar7._8_8_ = auVar8._8_8_;
  auVar7._4_4_ = fVar17 * (1.0 - v) + -0.001;
  auVar7._0_4_ = auVar6._0_4_;
  auVar9._4_4_ = fVar17 + -1.0;
  auVar9._0_4_ = fVar12 + -1.0;
  auVar9._8_8_ = 0;
  auVar9 = minps(auVar7,auVar9);
  auVar10._4_4_ = auVar9._4_4_;
  iVar4 = -(uint)(0.0 < auVar9._0_4_);
  iVar5 = -(uint)(0.0 < auVar10._4_4_);
  auVar15._4_4_ = iVar5;
  auVar15._0_4_ = iVar4;
  auVar15._8_4_ = iVar5;
  auVar15._12_4_ = iVar5;
  auVar14._8_8_ = auVar15._8_8_;
  auVar14._4_4_ = iVar4;
  auVar14._0_4_ = iVar4;
  uVar3 = movmskpd(in_ECX,auVar14);
  iVar4 = (int)auVar9._0_4_;
  if ((uVar3 & 1) == 0) {
    iVar4 = 0;
  }
  auVar10._0_4_ = auVar10._4_4_;
  auVar10._8_4_ = auVar10._4_4_;
  auVar10._12_4_ = auVar10._4_4_;
  iVar5 = (int)auVar10._4_4_;
  if ((uVar3 & 2) == 0) {
    iVar5 = 0;
  }
  lVar2 = (long)((iVar13 * iVar5 + iVar4) * 3);
  auVar11._4_12_ = auVar10._4_12_;
  auVar11._0_4_ = (float)*(byte *)(*(long *)(pos[1].e + 1) + 2 + lVar2) / 255.0;
  uVar1 = *(ushort *)(*(long *)(pos[1].e + 1) + lVar2);
  auVar16._0_4_ = (float)(uVar1 & 0xff);
  auVar16._4_4_ = (float)(byte)(uVar1 >> 8);
  auVar16._8_8_ = 0;
  auVar9 = divps(auVar16,_DAT_001151b0);
  (this->super_Texture)._vptr_Texture = auVar9._0_8_;
  this->m_width = (int)auVar11._0_4_;
  VVar18.e._0_8_ = auVar11._0_8_;
  VVar18.e[2] = auVar9._0_4_;
  return (Vec3)VVar18.e;
}

Assistant:

virtual Vec3 GetValue(float u, float v, const Vec3& pos) const override {
		int   _i		= (int)std::max(0.0f, std::min(m_width  - 1.0f, (u)*m_width));
		int   _j		= (int)std::max(0.0f, std::min(m_height - 1.0f, (1.0f - v)*m_height - 0.001f));

		int	  _i3       = _i * 3;
		int	  _j3_width = _j * 3 * m_width;
		float _r		= int(m_data[_i3 + _j3_width]    ) / 255.0f;
		float _g		= int(m_data[_i3 + _j3_width + 1]) / 255.0f;
		float _b		= int(m_data[_i3 + _j3_width + 2]) / 255.0f;

		return Vec3(_r, _g, _b);
	}